

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O2

void __thiscall FTextureManager::LoadTextureDefs(FTextureManager *this,int wadnum,char *lumpname)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  FTextureID picnum;
  int iVar10;
  FTexture *pFVar11;
  FTexture *this_00;
  BYTE BVar12;
  uint i;
  ulong uVar13;
  char *format;
  FName texname;
  undefined4 uStack_16c;
  FString src;
  TArray<FTextureID,_FTextureID> tlist;
  int lastLump;
  char *local_140;
  FString local_138;
  FScanner sc;
  
  src.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  lastLump = 0;
  tlist.Array = (FTextureID *)0x0;
  tlist.Most = 0;
  tlist.Count = 0;
  local_140 = lumpname;
LAB_005a904c:
  do {
    iVar8 = FWadCollection::FindLump(&Wads,local_140,&lastLump,false);
    if (iVar8 == -1) {
      TArray<FTextureID,_FTextureID>::~TArray(&tlist);
      FString::~FString(&src);
      return;
    }
    iVar9 = FWadCollection::GetLumpFile(&Wads,iVar8);
  } while (iVar9 != wadnum);
  FScanner::FScanner(&sc,iVar8);
LAB_005a908d:
  do {
    bVar6 = FScanner::GetString(&sc);
    if (!bVar6) break;
    bVar6 = FScanner::Compare(&sc,"remap");
    if (bVar6) {
      FScanner::MustGetString(&sc);
      bVar6 = FScanner::Compare(&sc,"wall");
      if (bVar6) {
        BVar1 = '\x01';
LAB_005a92d7:
        bVar4 = 1;
        bVar5 = false;
LAB_005a92d8:
        bVar6 = bVar5;
        bVar3 = bVar4;
        BVar12 = BVar1;
        FScanner::MustGetString(&sc);
        bVar2 = 0;
      }
      else {
        bVar6 = FScanner::Compare(&sc,"flat");
        if (bVar6) {
          BVar1 = '\x02';
          goto LAB_005a92d7;
        }
        bVar7 = FScanner::Compare(&sc,"sprite");
        bVar3 = 0;
        bVar2 = 1;
        BVar12 = '\0';
        bVar6 = false;
        BVar1 = '\x03';
        bVar4 = 0;
        bVar5 = true;
        if (bVar7) goto LAB_005a92d8;
      }
      sc.String[8] = '\0';
      TArray<FTextureID,_FTextureID>::Clear(&tlist);
      ListTextures(this,sc.String,&tlist);
      FName::FName(&texname,sc.String);
      FScanner::MustGetString(&sc);
      iVar8 = FWadCollection::CheckNumForFullName(&Wads,sc.String,true,0xe);
      if (iVar8 == -1) {
        iVar8 = FWadCollection::CheckNumForFullName(&Wads,sc.String,true,0xf);
      }
      format = "Attempting to remap non-existent texture %s to %s\n";
      if ((tlist.Count == 0) ||
         (format = "Attempting to remap texture %s to non-existent lump %s\n", iVar8 == -1)) {
        Printf(format,FName::NameData.NameArray[texname.Index].Text,sc.String);
      }
      else {
        for (uVar13 = 0; uVar13 < tlist.Count; uVar13 = uVar13 + 1) {
          pFVar11 = (this->Textures).Array[tlist.Array[uVar13].texnum].Texture;
          BVar1 = pFVar11->UseType;
          if ((((bool)(BVar1 == '\n' & bVar3) || (bool)(BVar12 == BVar1 | bVar2)) ||
              (((BVar1 == '\b' && bVar6 &&
                (iVar9 = (*pFVar11->_vptr_FTexture[6])(pFVar11), -1 < iVar9)) &&
               (iVar9 = FWadCollection::GetLumpNamespace(&Wads,iVar9), iVar9 == 1)))) &&
             (this_00 = FTexture::CreateTexture(iVar8,0), this_00 != (FTexture *)0x0)) {
            this_00->field_0x31 = this_00->field_0x31 | 4;
            iVar9 = FTexture::GetScaledWidth(pFVar11);
            iVar10 = FTexture::GetScaledHeight(pFVar11);
            FTexture::SetScaledSize(this_00,iVar9,iVar10);
            iVar9 = FTexture::GetScaledLeftOffset(pFVar11);
            this_00->LeftOffset = (SWORD)(int)((double)iVar9 * (this_00->Scale).X);
            iVar9 = FTexture::GetScaledTopOffset(pFVar11);
            this_00->TopOffset = (SWORD)(int)((double)iVar9 * (this_00->Scale).Y);
            ReplaceTexture(this,(FTextureID)tlist.Array[uVar13].texnum,this_00,true);
          }
        }
      }
      goto LAB_005a908d;
    }
    bVar6 = FScanner::Compare(&sc,"define");
    if (bVar6) {
      FScanner::GetString(&sc);
      ExtractFileBase((char *)&texname,SUB81(sc.String,0));
      if (*(int *)(CONCAT44(uStack_16c,texname.Index) + -0xc) != 0) {
        FString::Left(&local_138,(size_t)&texname);
        FString::operator=(&src,&local_138);
        FString::~FString(&local_138);
        iVar8 = FWadCollection::CheckNumForFullName(&Wads,sc.String,true,0xe);
        if (iVar8 == -1) {
          iVar8 = FWadCollection::CheckNumForFullName(&Wads,sc.String,true,0xf);
        }
        FScanner::GetString(&sc);
        bVar6 = FScanner::Compare(&sc,"force32bit");
        if (!bVar6) {
          FScanner::UnGet(&sc);
        }
        FScanner::GetNumber(&sc);
        iVar9 = sc.Number;
        FScanner::GetNumber(&sc);
        iVar10 = sc.Number;
        if ((-1 < iVar8) &&
           (pFVar11 = FTexture::CreateTexture(iVar8,10), pFVar11 != (FTexture *)0x0)) {
          pFVar11->field_0x31 = pFVar11->field_0x31 | 4;
          FTexture::SetScaledSize(pFVar11,iVar9,iVar10);
          FString::operator=(&pFVar11->Name,&src);
          picnum = CheckForTexture(&TexMan,src.Chars,8,1);
          if (picnum.texnum < 1) {
            AddTexture(this,pFVar11);
          }
          else {
            ReplaceTexture(this,picnum,pFVar11,true);
            pFVar11->UseType = '\n';
          }
        }
      }
      FString::~FString((FString *)&texname);
      goto LAB_005a908d;
    }
    bVar6 = FScanner::Compare(&sc,"texture");
    iVar8 = 10;
    if (!bVar6) {
      bVar6 = FScanner::Compare(&sc,"sprite");
      iVar8 = 3;
      if (!bVar6) {
        bVar6 = FScanner::Compare(&sc,"walltexture");
        iVar8 = 1;
        if (!bVar6) {
          bVar6 = FScanner::Compare(&sc,"flat");
          iVar8 = 2;
          if (!bVar6) {
            bVar6 = FScanner::Compare(&sc,"graphic");
            iVar8 = 8;
            if (!bVar6) {
              FScanner::ScriptError(&sc,"Texture definition expected, found \'%s\'",sc.String);
              goto LAB_005a908d;
            }
          }
        }
      }
    }
    ParseXTexture(this,&sc,iVar8);
  } while( true );
  FScanner::~FScanner(&sc);
  goto LAB_005a904c;
}

Assistant:

void FTextureManager::LoadTextureDefs(int wadnum, const char *lumpname)
{
	int remapLump, lastLump;
	FString src;
	bool is32bit;
	int width, height;
	int type, mode;
	TArray<FTextureID> tlist;

	lastLump = 0;

	while ((remapLump = Wads.FindLump(lumpname, &lastLump)) != -1)
	{
		if (Wads.GetLumpFile(remapLump) == wadnum)
		{
			FScanner sc(remapLump);
			while (sc.GetString())
			{
				if (sc.Compare("remap")) // remap an existing texture
				{
					sc.MustGetString();

					// allow selection by type
					if (sc.Compare("wall")) type=FTexture::TEX_Wall, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("flat")) type=FTexture::TEX_Flat, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("sprite")) type=FTexture::TEX_Sprite, mode=0;
					else type = FTexture::TEX_Any, mode = 0;

					if (type != FTexture::TEX_Any) sc.MustGetString();

					sc.String[8]=0;

					tlist.Clear();
					int amount = ListTextures(sc.String, tlist);
					FName texname = sc.String;

					sc.MustGetString();
					int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
					if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

					if (tlist.Size() == 0)
					{
						Printf("Attempting to remap non-existent texture %s to %s\n",
							texname.GetChars(), sc.String);
					}
					else if (lumpnum == -1)
					{
						Printf("Attempting to remap texture %s to non-existent lump %s\n",
							texname.GetChars(), sc.String);
					}
					else
					{
						for(unsigned int i = 0; i < tlist.Size(); i++)
						{
							FTexture * oldtex = Textures[tlist[i].GetIndex()].Texture;
							int sl;

							// only replace matching types. For sprites also replace any MiscPatches
							// based on the same lump. These can be created for icons.
							if (oldtex->UseType == type || type == FTexture::TEX_Any ||
								(mode == TEXMAN_Overridable && oldtex->UseType == FTexture::TEX_Override) ||
								(type == FTexture::TEX_Sprite && oldtex->UseType == FTexture::TEX_MiscPatch &&
								(sl=oldtex->GetSourceLump()) >= 0 && Wads.GetLumpNamespace(sl) == ns_sprites)
								)
							{
								FTexture * newtex = FTexture::CreateTexture (lumpnum, FTexture::TEX_Any);
								if (newtex != NULL)
								{
									// Replace the entire texture and adjust the scaling and offset factors.
									newtex->bWorldPanning = true;
									newtex->SetScaledSize(oldtex->GetScaledWidth(), oldtex->GetScaledHeight());
									newtex->LeftOffset = int(oldtex->GetScaledLeftOffset() * newtex->Scale.X);
									newtex->TopOffset = int(oldtex->GetScaledTopOffset() * newtex->Scale.Y);
									ReplaceTexture(tlist[i], newtex, true);
								}
							}
						}
					}
				}
				else if (sc.Compare("define")) // define a new "fake" texture
				{
					sc.GetString();
					
					FString base = ExtractFileBase(sc.String, false);
					if (!base.IsEmpty())
					{
						src = base.Left(8);

						int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
						if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

						sc.GetString();
						is32bit = !!sc.Compare("force32bit");
						if (!is32bit) sc.UnGet();

						sc.GetNumber();
						width = sc.Number;
						sc.GetNumber();
						height = sc.Number;

						if (lumpnum>=0)
						{
							FTexture *newtex = FTexture::CreateTexture(lumpnum, FTexture::TEX_Override);

							if (newtex != NULL)
							{
								// Replace the entire texture and adjust the scaling and offset factors.
								newtex->bWorldPanning = true;
								newtex->SetScaledSize(width, height);
								newtex->Name = src;

								FTextureID oldtex = TexMan.CheckForTexture(src, FTexture::TEX_MiscPatch);
								if (oldtex.isValid()) 
								{
									ReplaceTexture(oldtex, newtex, true);
									newtex->UseType = FTexture::TEX_Override;
								}
								else AddTexture(newtex);
							}
						}
					}				
					//else Printf("Unable to define hires texture '%s'\n", tex->Name);
				}
				else if (sc.Compare("texture"))
				{
					ParseXTexture(sc, FTexture::TEX_Override);
				}
				else if (sc.Compare("sprite"))
				{
					ParseXTexture(sc, FTexture::TEX_Sprite);
				}
				else if (sc.Compare("walltexture"))
				{
					ParseXTexture(sc, FTexture::TEX_Wall);
				}
				else if (sc.Compare("flat"))
				{
					ParseXTexture(sc, FTexture::TEX_Flat);
				}
				else if (sc.Compare("graphic"))
				{
					ParseXTexture(sc, FTexture::TEX_MiscPatch);
				}
				else
				{
					sc.ScriptError("Texture definition expected, found '%s'", sc.String);
				}
			}
		}
	}
}